

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageTest::iterate(SwapBuffersWithDamageTest *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  EGLint numFrames;
  EGLint width;
  deUint32 dVar4;
  int iVar5;
  uint uVar6;
  Library *egl;
  int *piVar7;
  long lVar8;
  int iVar9;
  int in_R9D;
  long lVar10;
  pointer frame;
  float fVar11;
  float fVar12;
  float fVar13;
  vector<int,_std::allocator<int>_> damageRegion;
  FrameSequence frameSequence;
  Random rnd;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  vector<int,_std::allocator<int>_> local_80;
  long local_68;
  long local_60;
  FrameSequence local_58;
  deRandom local_40;
  
  deRandom_init(&local_40,this->m_seed);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  numFrames = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3057);
  width = eglu::querySurfaceInt(egl,this->m_eglDisplay,this->m_eglSurface,0x3056);
  fVar11 = deRandom_getFloat(&local_40);
  fVar12 = deRandom_getFloat(&local_40);
  fVar13 = deRandom_getFloat(&local_40);
  generateFrameSequence(&local_58,&this->m_frameDrawType,(Random *)&local_40,numFrames,width,in_R9D)
  ;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  (*egl->_vptr_Library[0x30])(egl,this->m_eglDisplay,this->m_eglSurface,0x3093,0x3095);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                   ,0x19b);
  if (0 < this->m_iterationTimes) {
    iVar5 = width / 2;
    iVar2 = numFrames * 2;
    uVar6 = 0;
    do {
      lVar10 = 1;
      lVar8 = 0;
      do {
        local_68 = lVar8;
        getDamageRegion(&local_80,
                        local_58.
                        super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar8);
        (*(this->m_gl).clearColor)(fVar11,fVar12,fVar13,1.0);
        (*(this->m_gl).clear)(0x4000);
        frame = local_58.
                super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                ._M_impl.super__Vector_impl_data._M_start;
        local_60 = lVar10;
        do {
          GLES2Renderer::render(this->m_gles2Renderer,numFrames,width,frame);
          lVar3 = local_60;
          frame = frame + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        if (this->m_resizeType == RESIZETYPE_BEFORE_SWAP) {
          if ((uVar6 & 1) == 0) {
            piVar7 = &local_88;
            local_88 = iVar2;
            local_84 = iVar5;
          }
          else {
            piVar7 = &local_90;
            local_90 = iVar5;
            local_8c = iVar2;
          }
          (*this->m_window->_vptr_NativeWindow[6])(this->m_window,piVar7);
        }
        iVar1 = (int)((ulong)((long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
        iVar9 = iVar1 + 3;
        if (-1 < iVar1) {
          iVar9 = iVar1;
        }
        (*egl->_vptr_Library[0x32])
                  (egl,this->m_eglDisplay,this->m_eglSurface,
                   local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(ulong)(uint)(iVar9 >> 2));
        dVar4 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar4,
                         "swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                         ,0x1af);
        if (this->m_resizeType == RESIZETYPE_AFTER_SWAP) {
          if ((uVar6 & 1) == 0) {
            piVar7 = &local_98;
            local_98 = iVar2;
            local_94 = iVar5;
          }
          else {
            piVar7 = &local_a0;
            local_a0 = iVar5;
            local_9c = iVar2;
          }
          (*this->m_window->_vptr_NativeWindow[6])(this->m_window,piVar7);
        }
        if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        lVar8 = local_68 + 1;
        lVar10 = lVar3 + 1;
      } while (lVar8 != 0x18);
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < this->m_iterationTimes);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector(&local_58);
  return STOP;
}

Assistant:

TestCase::IterateResult SwapBuffersWithDamageTest::iterate (void)
{
	de::Random			rnd				(m_seed);
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const int			width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int			height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float			clearRed		= rnd.getFloat();
	const float			clearGreen		= rnd.getFloat();
	const float			clearBlue		= rnd.getFloat();
	const tcu::Vec4		clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int			numFrames		= 24; // (width, height) = (480, 480) --> numFrame = 24, divisible
	const FrameSequence frameSequence	= generateFrameSequence(m_frameDrawType, rnd, numFrames, width, height);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int iterationNdx = 0; iterationNdx < m_iterationTimes; iterationNdx++)
	{
		for (int currentFrameNdx = 0; currentFrameNdx < numFrames; currentFrameNdx++)
		{
			vector<EGLint>	damageRegion = getDamageRegion(frameSequence[currentFrameNdx]);

			clearColorScreen(m_gl, clearColor);
			for (int ndx = 0; ndx <= currentFrameNdx; ndx++)
				m_gles2Renderer->render(width, height, frameSequence[ndx]);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}
		}
	}
	return STOP;
}